

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O1

Integer * copy_map64(int64_t *block,int block_ndim,int64_t *map)

{
  long lVar1;
  ulong uVar2;
  Integer *pIVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if (block_ndim < 1) {
    lVar6 = 0;
  }
  else {
    uVar2 = 0;
    lVar6 = 0;
    do {
      lVar6 = lVar6 + block[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)block_ndim != uVar2);
  }
  pIVar3 = (Integer *)malloc(lVar6 * 8);
  if (0 < block_ndim) {
    uVar2 = 0;
    lVar4 = 0;
    do {
      lVar1 = block[uVar2];
      lVar6 = lVar6 - lVar1;
      if (0 < lVar1) {
        lVar5 = 0;
        do {
          pIVar3[lVar6 + lVar5] = map[lVar4 + lVar5] + 1;
          lVar5 = lVar5 + 1;
        } while (lVar1 != lVar5);
      }
      lVar4 = lVar4 + lVar1;
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)block_ndim);
  }
  return pIVar3;
}

Assistant:

static Integer* copy_map64(int64_t block[], int block_ndim, int64_t map[])
{
    int d;
    int64_t i,sum=0,capi_offset=0,map_offset=0;
    Integer *_ga_map_capi;

    for (d=0; d<block_ndim; d++) {
        sum += block[d];
    }

    _ga_map_capi = (Integer*)malloc(sum * sizeof(Integer));

    capi_offset = sum;
    for (d=0; d<block_ndim; d++) {
        capi_offset -= block[d];
        for (i=0; i<block[d]; i++) {
            _ga_map_capi[capi_offset+i] = map[map_offset+i] + 1;
        }
        map_offset += block[d];
    }

    return _ga_map_capi;
}